

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

bool duckdb::RowGroupCollection::InitializeScanInRowGroup
               (CollectionScanState *state,RowGroupCollection *collection,RowGroup *row_group,
               idx_t vector_index,idx_t max_row)

{
  bool bVar1;
  
  state->max_row = max_row;
  state->row_groups =
       (collection->row_groups).internal.
       super___shared_ptr<duckdb::RowGroupSegmentTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((state->column_scans).
      super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
      .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl ==
      (ColumnScanState *)0x0) {
    CollectionScanState::Initialize(state,&collection->types);
  }
  bVar1 = RowGroup::InitializeScanWithOffset(row_group,state,vector_index);
  return bVar1;
}

Assistant:

bool RowGroupCollection::InitializeScanInRowGroup(CollectionScanState &state, RowGroupCollection &collection,
                                                  RowGroup &row_group, idx_t vector_index, idx_t max_row) {
	state.max_row = max_row;
	state.row_groups = collection.row_groups.get();
	if (!state.column_scans) {
		// initialize the scan state
		state.Initialize(collection.GetTypes());
	}
	return row_group.InitializeScanWithOffset(state, vector_index);
}